

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_spatializer_listener_init
                    (ma_spatializer_listener_config *pConfig,
                    ma_allocation_callbacks *pAllocationCallbacks,ma_spatializer_listener *pListener
                    )

{
  bool bVar1;
  ma_result mVar2;
  size_t __size;
  void *pHeap;
  ulong uVar3;
  
  mVar2 = MA_INVALID_ARGS;
  __size = 0;
  if ((pConfig == (ma_spatializer_listener_config *)0x0) || ((ulong)pConfig->channelsOut == 0)) {
    uVar3 = 0;
    bVar1 = false;
  }
  else {
    uVar3 = (ulong)pConfig->channelsOut + 7 & 0xfffffffffffffff8;
    bVar1 = true;
    mVar2 = MA_SUCCESS;
  }
  if (bVar1) {
    mVar2 = MA_SUCCESS;
    __size = uVar3;
  }
  if (mVar2 == MA_SUCCESS) {
    if (__size == 0) {
      pHeap = (void *)0x0;
    }
    else {
      if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
        pHeap = malloc(__size);
      }
      else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
        pHeap = (void *)0x0;
      }
      else {
        pHeap = (*pAllocationCallbacks->onMalloc)(__size,pAllocationCallbacks->pUserData);
      }
      if (pHeap == (void *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    mVar2 = ma_spatializer_listener_init_preallocated(pConfig,pHeap,pListener);
    if (mVar2 == MA_SUCCESS) {
      pListener->_ownsHeap = 1;
      mVar2 = MA_SUCCESS;
    }
    else {
      ma_free(pHeap,pAllocationCallbacks);
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_spatializer_listener_init(const ma_spatializer_listener_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_spatializer_listener* pListener)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_spatializer_listener_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_spatializer_listener_init_preallocated(pConfig, pHeap, pListener);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pListener->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}